

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  uint32 uVar1;
  float32 *pfVar2;
  long lVar3;
  float32 *pfVar4;
  long lVar5;
  long lVar6;
  vector_t pfVar7;
  void ***pppvVar8;
  void ***pppvVar9;
  bool bVar10;
  size_t d1;
  int iVar11;
  int32 iVar12;
  uint uVar13;
  cmd_ln_t *pcVar14;
  char *pcVar15;
  FILE *pFVar16;
  void *pvVar17;
  int32 *piVar18;
  float32 ***mixw;
  size_t sVar19;
  node *sroot;
  float32 **ppfVar20;
  ulong uVar21;
  void ****ppppvVar22;
  char *pcVar23;
  ulong uVar24;
  ulong uVar25;
  void *pvVar26;
  long lVar27;
  ulong uVar28;
  void *pvVar29;
  float32 **ppfVar30;
  ulong uVar31;
  int32 *piVar32;
  vector_t **pppfVar33;
  uint uVar34;
  int32 *piVar35;
  double dVar36;
  double dVar37;
  float fVar38;
  float fVar39;
  uint32 n_density;
  uint32 n_stream;
  float32 **local_160;
  uint32 t_ndensity;
  void ****local_150;
  float32 **local_148;
  ulong local_140;
  uint local_134;
  int local_130;
  uint32 t_nfeat;
  float32 **local_128;
  float32 **local_120;
  ulong local_118;
  void *local_110;
  void *local_108;
  void *local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  float32 **local_e0;
  int32 *local_d8;
  model_def_t *mdef;
  uint32 t_nstates;
  ulong local_c0;
  uint32 *l_veclen;
  char *local_b0;
  ulong local_a8;
  FILE *local_a0;
  vector_t ****local_98;
  vector_t ***fullvar;
  vector_t ***fullmean;
  uint32 *t_veclen;
  uint32 l_nstates;
  undefined8 local_70;
  float32 **local_68;
  ulong local_60;
  size_t local_58;
  long local_50;
  long local_48;
  float32 ***in_mixw;
  uint32 n_in_mixw;
  
  parse_cmd_ln(argc,argv);
  pcVar14 = cmd_ln_get();
  pcVar15 = cmd_ln_str_r(pcVar14,"-type");
  if (pcVar15 == (char *)0x0) {
    pcVar15 = "-type is empty. Please specify -type correctly, either \".cont.\" or \".semi.\"\n";
    lVar27 = 0x3fd;
    goto LAB_00105dcd;
  }
  local_130 = strcmp(pcVar15,".cont.");
  if (local_130 == 0) {
    local_70 = 1;
LAB_00104c61:
    pcVar14 = cmd_ln_get();
    pcVar15 = cmd_ln_str_r(pcVar14,"-questfn");
    pcVar14 = cmd_ln_get();
    local_48 = cmd_ln_int_r(pcVar14,"-npermute");
    pcVar14 = cmd_ln_get();
    local_50 = cmd_ln_int_r(pcVar14,"-qstperstt");
    local_b0 = pcVar15;
    pFVar16 = fopen(pcVar15,"w");
    if (pFVar16 != (FILE *)0x0) {
      fwrite("WDBNDRY_B\nWDBNDRY_E\nWDBNDRY_S\nWDBNDRY_I\nSILENCE   SIL\n",0x36,1,pFVar16);
      fclose(pFVar16);
      fullmean = (vector_t ***)0x0;
      fullvar = (vector_t ***)0x0;
      local_98 = (vector_t ****)0x0;
      pcVar14 = cmd_ln_get();
      pcVar15 = cmd_ln_str_r(pcVar14,"-moddeffn");
      if (pcVar15 == (char *)0x0) {
        pcVar15 = "Specify -moddeffn\n";
        lVar27 = 0x316;
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                ,0x318,"Reading: %s\n",pcVar15);
        iVar12 = model_def_read(&mdef,pcVar15);
        if (iVar12 == 0) {
          uVar34 = mdef->acmod_set->n_ci;
          uVar24 = (ulong)uVar34;
          pvVar17 = __ckd_calloc_2d__(uVar24,100,1,
                                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                      ,0x31e);
          local_f0 = CONCAT44(local_f0._4_4_,uVar34 - 1);
          if (uVar34 != 0) {
            uVar31 = 0;
            do {
              pcVar15 = *(char **)((long)pvVar17 + uVar31 * 8);
              pcVar23 = acmod_set_id2name(mdef->acmod_set,(acmod_id_t)uVar31);
              strcpy(pcVar15,pcVar23);
              uVar31 = uVar31 + 1;
            } while (uVar24 != uVar31);
          }
          local_160 = (float32 **)CONCAT44(local_160._4_4_,*mdef->defn->state);
          pcVar14 = cmd_ln_get();
          pcVar15 = cmd_ln_str_r(pcVar14,"-mixwfn");
          if (pcVar15 == (char *)0x0) {
            pcVar15 = "Specify -mixwfn\n";
            lVar27 = 0x329;
            goto LAB_00105dcd;
          }
          local_118 = 0;
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                  ,0x32b,"Reading: %s\n",pcVar15);
          iVar11 = s3mixw_read(pcVar15,&in_mixw,&n_in_mixw,&n_stream,&n_density);
          if (iVar11 != 0) goto LAB_00104ea1;
          uVar1 = mdef->defn->n_state;
          uVar31 = (ulong)n_stream;
          uVar28 = (ulong)n_density;
          if ((uint)local_f0 != 0) {
            uVar13 = 1;
            do {
              if (mdef->defn[uVar13].n_state != uVar1) {
                pcVar15 = "Models do not have uniform topology\n";
                lVar27 = 0x33b;
                goto LAB_00105dcd;
              }
              uVar13 = uVar13 + 1;
            } while (uVar13 <= (uint)local_f0);
          }
          ppfVar20 = (float32 **)(ulong)(uVar1 - 1);
          local_148 = ppfVar20;
          local_128 = (float32 **)
                      __ckd_calloc_2d__(uVar24,(size_t)ppfVar20,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                        ,0x347);
          uVar21 = 1;
          if (1 < uVar34) {
            uVar21 = (ulong)uVar34;
          }
          uVar25 = 0;
          do {
            if ((int)local_148 != 0) {
              ppfVar30 = (float32 **)0x0;
              do {
                *(float32 ***)(local_128[uVar25] + (long)ppfVar30 * 2) =
                     in_mixw[mdef->defn[uVar25].state[(long)ppfVar30] - (uint)local_160];
                ppfVar30 = (float32 **)((long)ppfVar30 + 1);
              } while (ppfVar20 != ppfVar30);
            }
            uVar25 = uVar25 + 1;
          } while (uVar25 != uVar21);
          if (uVar34 != (uint)uVar25) {
            __assert_fail("j == n_model",
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                          ,0x352,
                          "int init(float32 *****, float32 ****, float32 ****, uint32 *, uint32 *, uint32 *, uint32 *, uint32 *, char ***, int)"
                         );
          }
          local_140 = uVar24;
          if (local_130 == 0) {
            pcVar14 = cmd_ln_get();
            lVar27 = cmd_ln_int_r(pcVar14,"-fullvar");
            pcVar14 = cmd_ln_get();
            pcVar15 = cmd_ln_str_r(pcVar14,"-meanfn");
            iVar11 = s3gau_read(pcVar15,&fullmean,&l_nstates,&t_nfeat,&t_ndensity,&l_veclen);
            if (iVar11 != 0) {
              pcVar14 = cmd_ln_get();
              pcVar15 = cmd_ln_str_r(pcVar14,"-meanfn");
              pcVar23 = "Error reading mean file %s\n";
              lVar27 = 0x35d;
              goto LAB_00105d84;
            }
            local_118 = (ulong)*l_veclen;
            if ((t_nfeat != n_stream) && (t_ndensity != n_density)) {
              pcVar15 = "Mismatch between Mean and Mixture weight files\n";
              lVar27 = 0x360;
              goto LAB_00105dcd;
            }
            pcVar14 = cmd_ln_get();
            pcVar15 = cmd_ln_str_r(pcVar14,"-varfn");
            if ((int)lVar27 == 0) {
              iVar11 = s3gau_read(pcVar15,&fullvar,&t_nstates,&t_nfeat,&t_ndensity,&t_veclen);
              if (iVar11 == 0) goto LAB_00105768;
              pcVar14 = cmd_ln_get();
              pcVar15 = cmd_ln_str_r(pcVar14,"-varfn");
              pcVar23 = "Error reading var file %s\n";
              lVar27 = 0x372;
            }
            else {
              iVar11 = s3gau_read_full(pcVar15,&local_98,&t_nstates,&t_nfeat,&t_ndensity,&t_veclen);
              if (iVar11 == 0) {
LAB_00105768:
                if ((t_nfeat != n_stream) && (t_ndensity != n_density)) {
                  pcVar15 = "Mismatch between Variance and Mixture weight files\n";
                  lVar27 = 0x375;
                  goto LAB_00105dcd;
                }
                if ((ulong)n_stream != 0) {
                  uVar24 = 0;
                  do {
                    if (t_veclen[uVar24] != l_veclen[uVar24]) {
                      err_msg(ERR_FATAL,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                              ,0x378,
                              "Feature length %d in var file != %d in mean file for feature %d\n",
                              (ulong)t_veclen[uVar24],(ulong)l_veclen[uVar24],uVar24);
                      goto LAB_00105cff;
                    }
                    uVar24 = uVar24 + 1;
                  } while (n_stream != uVar24);
                }
                if (l_nstates != t_nstates) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                          ,0x37a,"Total no. of states %d in var file != %d in mean file\n",
                          (ulong)t_nstates);
                  goto LAB_00105cff;
                }
                if (1 < t_nfeat) {
                  err_msg(ERR_FATAL,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                          ,0x37d,"N-Feat = %d! N-Feat > 1 not implemented yet..\n");
                  goto LAB_00105cff;
                }
                local_100 = pvVar17;
                if (1 < t_ndensity) {
                  err_msg(ERR_WARN,
                          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                          ,0x37f,
                          "The state distributions given have %d gaussians per state;\n..*..shrinking them down to 1 gau per state..\n"
                         );
                }
                uVar24 = local_140;
                uVar31 = 0;
                if ((ulong)n_stream != 0) {
                  uVar28 = 0;
                  do {
                    uVar34 = (int)uVar31 + t_veclen[uVar28];
                    uVar31 = (ulong)uVar34;
                    uVar28 = uVar28 + 1;
                  } while (n_stream != uVar28);
                  uVar31 = (ulong)uVar34;
                }
                local_108 = __ckd_calloc_3d__(local_140,(size_t)ppfVar20,uVar31,4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                              ,0x385);
                local_110 = __ckd_calloc_3d__(uVar24,(size_t)ppfVar20,uVar31,4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                              ,0x387);
                local_150 = __ckd_calloc_4d__(uVar24,(size_t)ppfVar20,1,1,4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                              ,0x388);
                pcVar14 = cmd_ln_get();
                dVar36 = cmd_ln_float_r(pcVar14,"-varfloor");
                local_d8 = (int32 *)(ulong)n_density;
                uVar24 = 0;
                uVar34 = (uint)local_160;
                do {
                  local_a8 = uVar24;
                  local_120 = ppfVar20;
                  if ((int)local_148 != 0) {
                    local_a0 = *(FILE **)((long)local_108 + local_a8 * 8);
                    local_c0 = *(ulong *)((long)local_110 + local_a8 * 8);
                    uVar24 = (ulong)*l_veclen;
                    ppfVar30 = (float32 **)0x0;
                    do {
                      local_e0 = ppfVar30;
                      lVar3 = *(long *)(&local_a0->_flags + (long)local_e0 * 2);
                      lVar5 = *(long *)(local_c0 + (long)local_e0 * 8);
                      local_160 = (float32 **)CONCAT44(local_160._4_4_,uVar34);
                      if (local_d8 == (int32 *)0x0) {
                        dVar37 = 0.0;
                      }
                      else {
                        lVar6 = **(long **)(local_128[local_a8] + (long)local_e0 * 2);
                        uVar13 = *l_veclen;
                        dVar37 = 0.0;
                        piVar18 = (int32 *)0x0;
                        do {
                          fVar38 = *(float *)(lVar6 + (long)piVar18 * 4);
                          if ((int32 *)(ulong)uVar13 != (int32 *)0x0) {
                            pfVar7 = (*fullmean[uVar34])[(long)piVar18];
                            piVar35 = (int32 *)0x0;
                            do {
                              *(float *)(lVar3 + (long)piVar35 * 4) =
                                   pfVar7[(long)piVar35] * fVar38 +
                                   *(float *)(lVar3 + (long)piVar35 * 4);
                              if ((int)lVar27 == 0) {
                                pppfVar33 = fullvar[uVar34];
                                piVar32 = piVar18;
                              }
                              else {
                                pppfVar33 = *local_98[uVar34] + (long)piVar18;
                                piVar32 = piVar35;
                              }
                              fVar39 = pfVar7[(long)piVar35];
                              *(float *)(lVar5 + (long)piVar35 * 4) =
                                   (fVar39 * fVar39 + (*pppfVar33)[(long)piVar32][(long)piVar35]) *
                                   fVar38 + *(float *)(lVar5 + (long)piVar35 * 4);
                              piVar35 = (int32 *)((long)piVar35 + 1);
                            } while ((int32 *)(ulong)uVar13 != piVar35);
                          }
                          dVar37 = dVar37 + (double)fVar38;
                          piVar18 = (int32 *)((long)piVar18 + 1);
                        } while (piVar18 != local_d8);
                      }
                      local_e8 = local_a8;
                      if ((dVar37 != 0.0) || (NAN(dVar37))) {
                        if (uVar24 != 0) {
                          uVar31 = 0;
                          do {
                            fVar38 = (float)((double)*(float *)(lVar3 + uVar31 * 4) / dVar37);
                            *(float *)(lVar3 + uVar31 * 4) = fVar38;
                            fVar39 = (float)((double)*(float *)(lVar5 + uVar31 * 4) / dVar37 -
                                            (double)(fVar38 * fVar38));
                            fVar38 = (float)dVar36;
                            if ((float)dVar36 <= fVar39) {
                              fVar38 = fVar39;
                            }
                            *(float *)(lVar5 + uVar31 * 4) = fVar38;
                            uVar31 = uVar31 + 1;
                          } while (uVar24 != uVar31);
                        }
                      }
                      else if (uVar24 != 0) {
                        uVar31 = 0;
                        do {
                          fVar38 = *(float *)(lVar3 + uVar31 * 4);
                          if ((fVar38 != 0.0) || (NAN(fVar38))) {
                            err_msg(ERR_FATAL,
                                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                    ,0x3aa,"dnom = 0, but featmean[nn] != 0, =  %f for ll = %d\n",
                                    (double)fVar38,0);
                            goto LAB_00105cff;
                          }
                          uVar31 = uVar31 + 1;
                        } while (uVar24 != uVar31);
                      }
                      *(float *)*local_150[local_a8][(long)local_e0] = (float)dVar37;
                      uVar34 = uVar34 + 1;
                      ppfVar30 = (float32 **)((long)local_e0 + 1);
                    } while ((float32 **)((long)local_e0 + 1) != ppfVar20);
                  }
                  uVar13 = (int)local_a8 + 1;
                  uVar24 = (ulong)uVar13;
                } while (uVar13 <= (uint)local_f0);
                if (local_140 == 0) {
                  uVar34 = 0;
                }
                else {
                  uVar24 = 0;
                  uVar34 = 0;
                  do {
                    pcVar15 = *(char **)((long)local_100 + uVar24 * 8);
                    pcVar23 = strchr(pcVar15,0x2b);
                    if ((pcVar23 == (char *)0x0) && (iVar11 = strcmp(pcVar15,"SIL"), iVar11 != 0)) {
                      uVar31 = (ulong)uVar34;
                      strcpy(*(char **)((long)local_100 + uVar31 * 8),pcVar15);
                      if ((int)local_148 != 0) {
                        pppvVar8 = local_150[uVar24];
                        pppvVar9 = local_150[uVar31];
                        uVar13 = *l_veclen;
                        ppfVar30 = (float32 **)0x0;
                        do {
                          *(undefined4 *)*pppvVar9[(long)ppfVar30] = **pppvVar8[(long)ppfVar30];
                          if ((ulong)uVar13 != 0) {
                            lVar27 = *(long *)(*(long *)((long)local_108 + uVar24 * 8) +
                                              (long)ppfVar30 * 8);
                            lVar3 = *(long *)(*(long *)((long)local_108 + uVar31 * 8) +
                                             (long)ppfVar30 * 8);
                            lVar5 = *(long *)(*(long *)((long)local_110 + uVar24 * 8) +
                                             (long)ppfVar30 * 8);
                            lVar6 = *(long *)(*(long *)((long)local_110 + uVar31 * 8) +
                                             (long)ppfVar30 * 8);
                            uVar28 = 0;
                            do {
                              *(undefined4 *)(lVar3 + uVar28 * 4) =
                                   *(undefined4 *)(lVar27 + uVar28 * 4);
                              *(undefined4 *)(lVar6 + uVar28 * 4) =
                                   *(undefined4 *)(lVar5 + uVar28 * 4);
                              uVar28 = uVar28 + 1;
                            } while (uVar13 != uVar28);
                          }
                          ppfVar30 = (float32 **)((long)ppfVar30 + 1);
                        } while (ppfVar30 != ppfVar20);
                      }
                      uVar34 = uVar34 + 1;
                    }
                    uVar24 = uVar24 + 1;
                  } while (uVar24 != local_140);
                }
                uVar31 = 1;
                uVar28 = 1;
                ppppvVar22 = local_150;
                pvVar26 = local_108;
                pvVar29 = local_110;
                pvVar17 = local_100;
                goto LAB_00105c73;
              }
              pcVar14 = cmd_ln_get();
              pcVar15 = cmd_ln_str_r(pcVar14,"-varfn");
              pcVar23 = "Error reading var file %s\n";
              lVar27 = 0x369;
            }
            goto LAB_00105d84;
          }
          ppppvVar22 = __ckd_calloc_4d__(uVar24,(size_t)ppfVar20,(ulong)n_stream,(ulong)n_density,4,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                         ,0x3c4);
          if (uVar24 == 0) {
            local_118 = 0;
            uVar34 = 0;
            pvVar26 = (void *)0x0;
            pvVar29 = (void *)0x0;
          }
          else {
            uVar24 = 0;
            uVar34 = 0;
            local_150 = ppppvVar22;
            local_f8 = uVar31;
            do {
              pcVar15 = *(char **)((long)pvVar17 + uVar24 * 8);
              pcVar23 = strchr(pcVar15,0x2b);
              if ((pcVar23 == (char *)0x0) && (iVar11 = strcmp(pcVar15,"SIL"), iVar11 != 0)) {
                strcpy(*(char **)((long)pvVar17 + (ulong)uVar34 * 8),pcVar15);
                if ((int)local_148 != 0) {
                  ppfVar30 = (float32 **)0x0;
                  do {
                    if ((ulong)n_stream != 0) {
                      uVar31 = 0;
                      do {
                        if ((ulong)n_density != 0) {
                          lVar27 = *(long *)(*(long *)(local_128[uVar24] + (long)ppfVar30 * 2) +
                                            uVar31 * 8);
                          pvVar26 = local_150[uVar34][(long)ppfVar30][uVar31];
                          uVar21 = 0;
                          do {
                            *(undefined4 *)((long)pvVar26 + uVar21 * 4) =
                                 *(undefined4 *)(lVar27 + uVar21 * 4);
                            uVar21 = uVar21 + 1;
                          } while (n_density != uVar21);
                        }
                        uVar31 = uVar31 + 1;
                      } while (uVar31 != n_stream);
                    }
                    ppfVar30 = (float32 **)((long)ppfVar30 + 1);
                  } while (ppfVar30 != ppfVar20);
                }
                uVar34 = uVar34 + 1;
              }
              uVar24 = uVar24 + 1;
            } while (uVar24 != local_140);
            local_118 = 0;
            ppppvVar22 = local_150;
            pvVar26 = (void *)0x0;
            pvVar29 = (void *)0x0;
            uVar31 = local_f8;
          }
LAB_00105c73:
          bVar10 = true;
          if (local_130 == 0) {
            local_134 = (uint)uVar28;
            ckd_free_4d(fullmean);
            if (fullvar != (vector_t ***)0x0) {
              ckd_free_4d(fullvar);
            }
            if (local_98 != (vector_t ****)0x0) {
              gauden_free_param_full(local_98);
            }
            uVar28 = (ulong)local_134;
          }
        }
        else {
          local_118 = 0;
          pvVar17 = (void *)0x0;
LAB_00104ea1:
          local_148 = (float32 **)0x0;
          uVar34 = 0;
          uVar31 = 0;
          uVar28 = 0;
          pvVar29 = (void *)0x0;
          pvVar26 = (void *)0x0;
          ppppvVar22 = (void ****)0x0;
          bVar10 = false;
        }
        local_150 = ppppvVar22;
        local_110 = pvVar29;
        local_108 = pvVar26;
        local_100 = pvVar17;
        if (bVar10) {
          if ((int)local_148 != 0) {
            local_58 = (size_t)uVar34;
            local_140 = uVar31 & 0xffffffff;
            local_134 = (uint)uVar28;
            local_c0 = local_118 & 0xffffffff;
            local_60 = (ulong)((int)local_148 * uVar34);
            local_68 = (float32 **)((ulong)local_148 & 0xffffffff);
            local_148 = (float32 **)((ulong)local_148 >> 1 & 0x7fffffff);
            ppfVar20 = (float32 **)0x0;
            local_120 = (float32 **)0x0;
            local_128 = (float32 **)0x0;
            local_f8 = uVar31;
            local_f0 = uVar28;
            do {
              d1 = local_58;
              local_160 = ppfVar20;
              piVar18 = (int32 *)__ckd_calloc__(local_58,4,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                ,0x425);
              __ckd_calloc__(1,0x30,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                             ,0x426);
              mixw = (float32 ***)
                     __ckd_calloc_3d__(d1,local_140,local_f0,4,
                                       "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                       ,0x428);
              uVar24 = local_c0;
              if (local_130 == 0) {
                local_120 = (float32 **)
                            __ckd_calloc_2d__(d1,local_c0,4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                              ,0x42a);
                local_128 = (float32 **)
                            __ckd_calloc_2d__(d1,uVar24,4,
                                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                              ,0x42b);
                if (uVar34 != 0) {
                  sVar19 = 0;
                  do {
                    piVar18[sVar19] = (int32)sVar19;
                    **mixw[sVar19] = **local_150[sVar19][(long)local_160];
                    if ((int)local_118 != 0) {
                      lVar27 = *(long *)(*(long *)((long)local_108 + sVar19 * 8) +
                                        (long)local_160 * 8);
                      pfVar2 = local_120[sVar19];
                      lVar3 = *(long *)(*(long *)((long)local_110 + sVar19 * 8) +
                                       (long)local_160 * 8);
                      pfVar4 = local_128[sVar19];
                      uVar24 = 0;
                      do {
                        pfVar2[uVar24] = *(float32 *)(lVar27 + uVar24 * 4);
                        pfVar4[uVar24] = *(float32 *)(lVar3 + uVar24 * 4);
                        uVar24 = uVar24 + 1;
                      } while (local_c0 != uVar24);
                    }
                    sVar19 = sVar19 + 1;
                  } while (sVar19 != d1);
                }
              }
              else if (uVar34 != 0) {
                sVar19 = 0;
                do {
                  piVar18[sVar19] = (int32)sVar19;
                  if ((int)local_f8 != 0) {
                    uVar24 = 0;
                    do {
                      if ((int)uVar28 != 0) {
                        pvVar17 = local_150[sVar19][(long)local_160][uVar24];
                        pfVar2 = mixw[sVar19][uVar24];
                        uVar31 = 0;
                        do {
                          pfVar2[uVar31] = *(float32 *)((long)pvVar17 + uVar31 * 4);
                          uVar31 = uVar31 + 1;
                        } while (local_f0 != uVar31);
                      }
                      uVar24 = uVar24 + 1;
                    } while (uVar24 != local_140);
                  }
                  sVar19 = sVar19 + 1;
                } while (sVar19 != d1);
              }
              sroot = make_tree(local_120,local_128,mixw,piVar18,uVar34,(int)uVar28,(int32)local_f8,
                                (int32)local_118,(int32)local_48,0,(int32)local_70);
              if (local_130 == 0) {
                ckd_free_2d(local_120);
                ckd_free_2d(local_128);
              }
              ckd_free_3d(mixw);
              ckd_free(piVar18);
              uVar24 = local_60;
              ppfVar20 = (float32 **)
                         __ckd_calloc__(local_60,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                        ,0x443);
              piVar18 = (int32 *)__ckd_calloc__(uVar24,4,
                                                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                                                ,0x444);
              prune_quests(sroot,(int32)local_50);
              local_e0 = ppfVar20;
              uVar13 = get_quests(sroot,(int32 **)ppfVar20,piVar18,0,0);
              free_tree(sroot);
              pFVar16 = fopen(local_b0,"a");
              local_e8 = (ulong)uVar13;
              local_a8 = CONCAT44(local_a8._4_4_,uVar13);
              if (0 < (int)uVar13) {
                uVar24 = 0;
                local_d8 = piVar18;
                local_a0 = pFVar16;
                do {
                  piVar18 = local_d8;
                  if (local_160 < local_148) {
                    pcVar15 = "QUESTION%d_%d_R ";
LAB_00105279:
                    fprintf(pFVar16,pcVar15,local_160,uVar24 & 0xffffffff);
                  }
                  else {
                    if (local_160 != local_148) {
                      pcVar15 = "QUESTION%d_%d_L ";
                      goto LAB_00105279;
                    }
                    fprintf(pFVar16,"QUESTION%d ",uVar24 & 0xffffffff);
                  }
                  pFVar16 = local_a0;
                  ppfVar20 = local_e0;
                  pvVar17 = local_100;
                  if (0 < piVar18[uVar24]) {
                    lVar27 = 0;
                    do {
                      fprintf(pFVar16," %s",
                              *(undefined8 *)
                               ((long)pvVar17 + (long)(int)ppfVar20[uVar24][lVar27] * 8));
                      lVar27 = lVar27 + 1;
                    } while (lVar27 < local_d8[uVar24]);
                  }
                  fputc(10,pFVar16);
                  uVar24 = uVar24 + 1;
                  piVar18 = local_d8;
                } while (uVar24 != local_e8);
              }
              fclose(pFVar16);
              ppfVar20 = local_160;
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                      ,0x455,"Done building questions using state %d\n",
                      (ulong)local_160 & 0xffffffff);
              iVar11 = (int)local_a8;
              err_msg(ERR_INFO,
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                      ,0x456," %d questions from state %d\n",local_a8 & 0xffffffff,
                      (ulong)ppfVar20 & 0xffffffff);
              ppfVar20 = local_e0;
              uVar24 = local_e8;
              if (0 < iVar11) {
                uVar31 = 0;
                do {
                  ckd_free(ppfVar20[uVar31]);
                  uVar31 = uVar31 + 1;
                } while (uVar24 != uVar31);
              }
              ckd_free(ppfVar20);
              ckd_free(piVar18);
              ppfVar20 = (float32 **)((long)local_160 + 1);
              uVar28 = (ulong)local_134;
            } while (ppfVar20 != local_68);
          }
          err_msg(ERR_INFO,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
                  ,0x45b,"Stored questions in %s\n",local_b0);
          return 0;
        }
        pcVar15 = "Initialization failed\n";
        lVar27 = 0x421;
      }
LAB_00105dcd:
      err_msg(ERR_FATAL,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
              ,lVar27,pcVar15);
      goto LAB_00105cff;
    }
    pcVar23 = "Unable to open %s for writing!\n";
    lVar27 = 0x413;
    pcVar15 = local_b0;
  }
  else {
    iVar11 = strcmp(pcVar15,".semi.");
    local_70 = 0;
    if (iVar11 == 0) goto LAB_00104c61;
    pcVar23 = "Unknown type %s, either \".cont.\" or \".semi.\"\n";
    lVar27 = 0x406;
  }
LAB_00105d84:
  err_msg(ERR_FATAL,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/make_quests/main.c"
          ,lVar27,pcVar23,pcVar15);
LAB_00105cff:
  exit(1);
}

Assistant:

int
main(int argc, char *argv[])
{
    float32 ****mixw = NULL,***lmixw = NULL;
    float32 ***means = NULL, **lmeans = NULL;
    float32 ***vars = NULL, **lvars = NULL;
    uint32 veclen = 0;
    uint32 n_model = 0;
    uint32 n_state = 0;
    uint32 n_feat = 0;
    uint32 n_density = 0;
    uint32 state;
    uint32 npermute, nquests_per_state;
    int32 i, j, k, continuous, **questarr, *nquestphone, nquests=0;
    int32  *phoneids,nphones;
    char   **phone_list = NULL;
    const char   *outfile;
    node   *root;
    FILE   *fp;
    const char* type;

    parse_cmd_ln(argc, argv);

    type = cmd_ln_str("-type");
    
    if(type==NULL){
      E_FATAL("-type is empty. Please specify -type correctly, either \".cont.\" or \".semi.\"\n");
    }

    continuous = -1;
    if (strcmp(type,".cont.") == 0) 
        continuous = 1;
    else if (strcmp(type,".semi.") == 0) 
        continuous = 0;
    else{
      E_FATAL("Unknown type %s, either \".cont.\" or \".semi.\"\n", type);
    }
      
    if(continuous ==-1){
      E_FATAL("-type is not set correctly\n");
    }

    outfile = cmd_ln_str("-questfn");
    npermute = cmd_ln_int32("-npermute");
    nquests_per_state = cmd_ln_int32("-qstperstt");

    /* Test and cleanup outfile */
    if ((fp = fopen(outfile,"w")) == NULL)
        E_FATAL("Unable to open %s for writing!\n",outfile);
    fprintf(fp,"WDBNDRY_B\nWDBNDRY_E\nWDBNDRY_S\nWDBNDRY_I\nSILENCE   SIL\n");
    fclose(fp);

    if (init(&mixw,
             &means,
             &vars,
             &veclen,
	     &n_model,
	     &n_state,
	     &n_feat,
             &n_density,
	     &phone_list,
	     continuous) != S3_SUCCESS) {
	E_FATAL("Initialization failed\n");
    }

    for (state = 0; state < n_state; state++){
        phoneids = (int32 *) ckd_calloc(n_model,sizeof(int32));
        root = (node *) ckd_calloc(1,sizeof(node));
        nphones = n_model;
        lmixw = (float32 ***)ckd_calloc_3d(n_model,n_feat,n_density,sizeof(float32));
        if (continuous) {
            lmeans = (float32 **)ckd_calloc_2d(n_model,veclen,sizeof(float32));
            lvars = (float32 **)ckd_calloc_2d(n_model,veclen,sizeof(float32));
            for (i=0;i<n_model;i++){
                phoneids[i] = i;
                lmixw[i][0][0] = mixw[i][state][0][0];
                for (j=0;j<veclen;j++){
                    lmeans[i][j] = means[i][state][j];
                    lvars[i][j] = vars[i][state][j];
                }
            }
        }
        else {
            for (i=0;i<n_model;i++){
                phoneids[i] = i;
                for (j=0;j<n_feat;j++)
                    for (k=0;k<n_density;k++)
                        lmixw[i][j][k] = mixw[i][state][j][k];
            }
        }
        root = make_tree(lmeans,lvars,lmixw,phoneids,nphones,n_density,n_feat,veclen,npermute,0, continuous);
        if (continuous) {
            ckd_free_2d((void **)lmeans); ckd_free_2d((void **)lvars); 
        }
        ckd_free_3d((void ***)lmixw); ckd_free((void *)phoneids);

        questarr = (int32 **)ckd_calloc(n_state*n_model,sizeof(int32 *));
        nquestphone = (int32 *)ckd_calloc(n_state*n_model,sizeof(int32));

        prune_quests(root,nquests_per_state);
        nquests = get_quests(root,questarr,nquestphone,0,0);

        free_tree(root);

        fp = fopen(outfile,"a");
        for (i=0;i<nquests;i++){
            if (state < n_state/2) fprintf(fp,"QUESTION%d_%d_R ",state,i);
            else if (state == n_state/2) fprintf(fp,"QUESTION%d ",i);
            else fprintf(fp,"QUESTION%d_%d_L ",state,i);
            for (j=0;j<nquestphone[i];j++) 
                fprintf(fp," %s",phone_list[questarr[i][j]]);
            fprintf(fp,"\n");
        }
        fclose(fp);
        E_INFO("Done building questions using state %d\n",state);
        E_INFO(" %d questions from state %d\n",nquests,state);
        for(i=0;i<nquests;i++) ckd_free((void *)questarr[i]);
        ckd_free((void **)questarr);
        ckd_free((void *)nquestphone);
    }
    E_INFO ("Stored questions in %s\n",outfile);
    return 0;
}